

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asp_preprocessor.cpp
# Opt level: O3

bool __thiscall Clasp::Asp::Preprocessor::classifyProgram(Preprocessor *this,VarVec *supported)

{
  size_type sVar1;
  uint uVar2;
  PrgNode PVar3;
  bool bVar4;
  undefined8 in_RAX;
  PrgBody *pPVar5;
  PrgAtom *pPVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  Var bodyId_00;
  uint uVar10;
  Var bodyId;
  undefined8 uStack_38;
  
  (this->follow_).ebo_.size = 0;
  uStack_38 = in_RAX;
  bVar4 = LogicProgram::propagate(this->prg_,true);
  uVar8 = 0;
  if (bVar4) {
    do {
      uVar10 = 0;
      while( true ) {
        sVar1 = (this->follow_).ebo_.size;
        if ((sVar1 == 0) || (uVar10 == sVar1)) break;
        if (this->dfs_ == true) {
          bodyId_00 = (this->follow_).ebo_.buf[sVar1 - 1];
          (this->follow_).ebo_.size = sVar1 - 1;
        }
        else {
          uVar7 = (ulong)uVar10;
          uVar10 = uVar10 + 1;
          bodyId_00 = (this->follow_).ebo_.buf[uVar7];
        }
        uStack_38 = CONCAT44(bodyId_00,(undefined4)uStack_38);
        if (bodyId_00 == 0x40000000) goto LAB_0017ff23;
        pPVar5 = addBodyVar(this,bodyId_00);
        pPVar6 = LogicProgram::getTrueAtom(this->prg_);
        if ((((ulong)(pPVar6->super_PrgHead).super_PrgNode & 0x7fffffff) != 0) ||
           (bVar4 = addHeadsToUpper(this,pPVar5), !bVar4)) {
          uVar8 = 0;
          goto LAB_0017ffd6;
        }
      }
      uStack_38 = CONCAT44(0x40000000,(undefined4)uStack_38);
LAB_0017ff23:
      (this->follow_).ebo_.size = 0;
      uVar10 = (supported->ebo_).size;
      if (uVar10 <= (uint)uVar8) break;
      uVar8 = uVar8 & 0xffffffff;
      do {
        uVar2 = (supported->ebo_).buf[uVar8];
        uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
        pPVar5 = (this->prg_->bodies_).ebo_.buf[uVar2];
        PVar3 = pPVar5->super_PrgNode;
        if ((int)(this->bodyInfo_).ebo_.buf[uVar2] < 0) {
          bVar9 = PVar3._7_1_ >> 6 & 1;
        }
        else {
          bVar9 = 1;
          if (((ulong)PVar3 >> 0x3e & 1) == 0) {
            bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&this->follow_,(uint *)((long)&uStack_38 + 4));
            break;
          }
        }
        if (bVar9 == 1 && (PVar3._0_4_ & 0x7fffffff) != 1) {
          pPVar5->super_PrgNode = (PrgNode)(((ulong)PVar3 & 0xffffffff80000000) + 1);
          uVar10 = (supported->ebo_).size;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar10);
    } while ((this->follow_).ebo_.size != 0);
    pPVar6 = LogicProgram::getTrueAtom(this->prg_);
    uVar8 = (ulong)(((ulong)(pPVar6->super_PrgHead).super_PrgNode & 0x7fffffff) == 0);
  }
LAB_0017ffd6:
  return SUB81(uVar8,0);
}

Assistant:

bool Preprocessor::classifyProgram(const VarVec& supported) {
	Var bodyId; PrgBody* body;
	VarVec::size_type index = 0;
	follow_.clear();
	if (!prg_->propagate(true)) { return false; }
	for (VarVec::size_type i = 0;;) {
		while ( (bodyId = nextBodyId(index)) != varMax ) {
			body = addBodyVar(bodyId);
			if (prg_->hasConflict())    { return false; }
			if (!addHeadsToUpper(body)) { return false; }
		}
		follow_.clear();
		index = 0;
		// select next unclassified supported body
		for (; i < supported.size(); ++i) {
			bodyId  = supported[i];
			body    = prg_->getBody(bodyId);
			if (bodyInfo_[bodyId].bSeen == 0 && body->relevant()) {
				follow_.push_back(bodyId);
				break;
			}
			else if (!body->relevant() && body->hasVar()) {
				body->clearLiteral(false);
			}
		}
		if (follow_.empty()) break;
	}
	return !prg_->hasConflict();
}